

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.hpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::getDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *dvType)

{
  bool bVar1;
  DatatypeValidator *pDVar2;
  XMLCh *dvType_local;
  DatatypeValidatorFactory *this_local;
  
  if (dvType != (XMLCh *)0x0) {
    if ((fBuiltInRegistry !=
         (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) &&
       (bVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                containsKey(fBuiltInRegistry,dvType), bVar1)) {
      pDVar2 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                         (fBuiltInRegistry,dvType);
      return pDVar2;
    }
    if ((this->fUserDefinedRegistry !=
         (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) &&
       (bVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                containsKey(this->fUserDefinedRegistry,dvType), bVar1)) {
      pDVar2 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                         (this->fUserDefinedRegistry,dvType);
      return pDVar2;
    }
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

inline DatatypeValidator*
DatatypeValidatorFactory::getDatatypeValidator(const XMLCh* const dvType) const
{
	if (dvType) {
        if (fBuiltInRegistry && fBuiltInRegistry->containsKey(dvType)) {
		    return fBuiltInRegistry->get(dvType);
        }

        if (fUserDefinedRegistry && fUserDefinedRegistry->containsKey(dvType)) {
		    return fUserDefinedRegistry->get(dvType);

        }
    }
	return 0;
}